

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

int Super2_LibCompareGates(Super2_Gate_t **ppG1,Super2_Gate_t **ppG2)

{
  Super2_Gate_t *pSVar1;
  Super2_Gate_t *pSVar2;
  uint local_40;
  uint local_3c;
  uint uTruth2;
  uint uTruth1;
  Super2_Gate_t *pG2;
  Super2_Gate_t *pG1;
  Super2_Gate_t **ppG2_local;
  Super2_Gate_t **ppG1_local;
  
  pSVar1 = *ppG1;
  pSVar2 = *ppG2;
  if ((pSVar1->uTruth & s_uMaskBit) == 0) {
    local_3c = pSVar1->uTruth;
  }
  else {
    local_3c = s_uMaskAll & (pSVar1->uTruth ^ 0xffffffff);
  }
  if ((pSVar2->uTruth & s_uMaskBit) == 0) {
    local_40 = pSVar2->uTruth;
  }
  else {
    local_40 = s_uMaskAll & (pSVar2->uTruth ^ 0xffffffff);
  }
  if (local_3c < local_40) {
    ppG1_local._4_4_ = -1;
  }
  else {
    ppG1_local._4_4_ = 1;
  }
  return ppG1_local._4_4_;
}

Assistant:

int Super2_LibCompareGates( Super2_Gate_t ** ppG1, Super2_Gate_t ** ppG2 )
{
    Super2_Gate_t * pG1  = *ppG1;
    Super2_Gate_t * pG2  = *ppG2;
    unsigned uTruth1, uTruth2;

    uTruth1 = (pG1->uTruth & s_uMaskBit)? s_uMaskAll & ~pG1->uTruth : pG1->uTruth;
    uTruth2 = (pG2->uTruth & s_uMaskBit)? s_uMaskAll & ~pG2->uTruth : pG2->uTruth;

    if ( uTruth1 < uTruth2 )
        return -1;
    return 1;
}